

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_comp(ASMState *as,IRIns *ir,uint32_t cc)

{
  uint8_t uVar1;
  ushort uVar2;
  IRIns *pIVar3;
  MCode *pMVar4;
  int iVar5;
  Reg RVar6;
  Reg rb;
  IRIns *pIVar7;
  uint in_EDX;
  IRIns *in_RSI;
  ASMState *in_RDI;
  bool bVar8;
  bool bVar9;
  Reg right_2;
  Reg left_3;
  x86Op xo;
  IRType1 origt_1;
  Reg left_2;
  IRType1 origt;
  IRIns *irll;
  RegSet allow;
  Reg left_1;
  Reg right_1;
  int usetest;
  IRIns *irl;
  int32_t imm;
  Reg r64;
  IROp leftop;
  IRRef rref_1;
  IRRef lref_1;
  IRRef tmp;
  MCLabel l_around;
  Reg right;
  Reg left;
  IRRef rref;
  IRRef lref;
  Reg in_stack_ffffffffffffff68;
  x86Group in_stack_ffffffffffffff6c;
  ASMState *in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  undefined1 uVar10;
  RegSet in_stack_ffffffffffffff80;
  IRRef in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  x86Op xVar11;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 uVar12;
  byte bVar13;
  uint local_70;
  Reg local_5c;
  Reg local_58;
  uint local_48;
  Reg local_44;
  uint local_40;
  IRRef local_3c;
  uint local_38;
  uint local_34;
  MCLabel local_30;
  Reg local_24;
  Reg local_20;
  uint local_1c;
  uint local_18;
  uint local_14;
  IRIns *local_10;
  ASMState *local_8;
  
  local_14 = in_EDX;
  local_8 = in_RDI;
  if (((in_RSI->field_1).t.irt & 0x1f) == 0xe) {
    local_18 = (uint)(in_RSI->field_0).op1;
    local_1c = (uint)(in_RSI->field_0).op2;
    if ((in_EDX & 0x4000) != 0) {
      local_14 = in_EDX ^ 0x6050;
      local_34 = local_18;
      local_1c = local_18;
      local_18 = (uint)(in_RSI->field_0).op2;
    }
    local_20 = ra_alloc1(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                         in_stack_ffffffffffffff68);
    iVar5 = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
    local_24 = asm_fuseload((ASMState *)
                            CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                            in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
    local_30 = local_8->mcp;
    asm_guardcc((ASMState *)
                CONCAT17(in_stack_ffffffffffffff7f,
                         CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)),iVar5);
    if ((local_14 & 0x2000) != 0) {
      if ((local_14 & 0x1000) == 0) {
        asm_guardcc((ASMState *)
                    CONCAT17(in_stack_ffffffffffffff7f,
                             CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)),iVar5);
      }
      else if (local_30 == local_8->invmcp) {
        local_8->loopinv = 2;
        if (local_8->realign == (MCode *)0x0) {
          emit_jcc(local_8,10,local_8->mcp);
        }
        else {
          emit_sjcc(local_8,10,local_8->mcp);
        }
      }
      else {
        emit_sjcc(local_8,10,local_30);
      }
    }
    emit_mrm(local_8,XO_UCOMISD,local_20,local_24);
    return;
  }
  local_38 = (uint)(in_RSI->field_0).op1;
  local_3c = (IRRef)(in_RSI->field_0).op2;
  local_40 = (uint)*(byte *)((long)in_RDI->ir + (ulong)local_38 * 8 + 5);
  local_44 = 0;
  if ((0x604208U >> ((in_RSI->field_1).t.irt & 0x1f) & 1) != 0) {
    local_44 = 0x80200;
  }
  local_48 = 0;
  if ((local_38 < 0x8000) ||
     ((0x7fff < local_3c &&
      (((((local_40 == 0x40 || (local_40 == 0x41)) || (local_40 == 0x42)) ||
        ((local_40 == 0x43 || (local_40 == 0x44)))) || ((local_40 == 0x45 || (local_40 == 0x46))))))
     )) {
    if ((in_EDX & 0xc) == 0xc) {
      local_14 = in_EDX ^ 0x53;
    }
    else if ((in_EDX & 10) == 2) {
      local_14 = in_EDX ^ 0x55;
    }
    local_38 = (uint)(in_RSI->field_0).op2;
    local_3c = (IRRef)(in_RSI->field_0).op1;
  }
  local_10 = in_RSI;
  iVar5 = asm_isk32(in_RDI,local_3c,(int32_t *)&local_48);
  if (iVar5 == 0) {
    RVar6 = ra_alloc1(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
    ;
    rb = asm_fuseloadm((ASMState *)
                       CONCAT17(in_stack_ffffffffffffff7f,
                                CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)),
                       (IRRef)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                       (RegSet)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    asm_guardcc((ASMState *)
                CONCAT17(in_stack_ffffffffffffff7f,
                         CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)),
                (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
    emit_mrm(local_8,XO_CMP,local_44 + RVar6,rb);
    return;
  }
  pIVar7 = local_8->ir + local_38;
  bVar8 = local_48 == 0;
  bVar9 = (local_14 & 10) != 2;
  uVar10 = bVar8 && bVar9;
  if (((!bVar8 || !bVar9) || ((pIVar7->field_1).o != ' ')) ||
     ((pIVar7 + 1 != local_10 ||
      ((((pIVar7->field_1).r & 0x80) == 0 || ((pIVar7->field_1).s != '\0')))))) {
    if (((((pIVar7->field_1).o == '@') ||
         (((((pIVar7->field_1).o == 'A' || ((pIVar7->field_1).o == 'B')) ||
           ((pIVar7->field_1).o == 'C')) ||
          (((pIVar7->field_1).o == 'D' || ((pIVar7->field_1).o == 'E')))))) ||
        ((pIVar7->field_1).o == 'F')) &&
       ((((((pIVar7->field_1).t.irt & 0x1f) == 0x10 && (local_48 == (local_48 & 0xff))) ||
         (((((pIVar7->field_1).t.irt & 0x1f) == 0xf || (((pIVar7->field_1).t.irt & 0x1f) == 0x11))
          && (local_48 == (int)(char)local_48)))) ||
        (((((pIVar7->field_1).t.irt & 0x1f) == 0x12 && (local_48 == (local_48 & 0xffff))) &&
         ((int)(short)local_48 == (int)(char)local_48)))))) {
      uVar12 = CONCAT13((pIVar7->field_1).t.irt,(int3)in_stack_ffffffffffffff8c);
      (pIVar7->field_1).t.irt = (pIVar7->field_1).t.irt & 0xe0 | 0x13;
      local_70 = asm_fuseload((ASMState *)CONCAT44(uVar12,in_stack_ffffffffffffff88),
                              in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
      bVar13 = (byte)((uint)uVar12 >> 0x18);
      *(byte *)&(pIVar7->field_0).ot = bVar13;
      if (local_70 == 0x20) {
        if ((((pIVar7->field_1).t.irt & 0x1f) == 0x10) || (((pIVar7->field_1).t.irt & 0x1f) == 0x12)
           ) {
          local_14 = local_14 >> 4;
        }
        asm_guardcc((ASMState *)
                    CONCAT17(uVar10,CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)),
                    (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
        pMVar4 = local_8->mcp;
        local_8->mcp = pMVar4 + -1;
        pMVar4[-1] = (MCode)local_48;
        xVar11 = XO_ARITHiw8;
        if ((bVar13 & 0x1f) == 0xf || (bVar13 & 0x1f) == 0x10) {
          xVar11 = XO_ARITHib;
        }
        emit_mrm(local_8,xVar11,local_44 + 7,0x20);
        return;
      }
    }
    else {
      local_70 = asm_fuseloadm((ASMState *)
                               CONCAT17(uVar10,CONCAT16(in_stack_ffffffffffffff7e,
                                                        in_stack_ffffffffffffff78)),
                               (IRRef)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                               (RegSet)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    }
    asm_guardcc((ASMState *)
                CONCAT17(uVar10,CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)),
                (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
    if ((bVar8 && bVar9) && (local_70 != 0x20)) {
      xVar11 = XO_TEST;
      if ((((local_10->field_1).t.irt & 0x1f) == 0x10) &&
         (xVar11 = XO_TESTb, (0xfU >> ((byte)local_70 & 0x1f) & 1) == 0)) {
        local_70 = local_70 | 0x200;
      }
      emit_rr(local_8,xVar11,local_44 + local_70,local_70);
      if (pIVar7 + 1 != local_10) {
        return;
      }
      local_8->flagmcp = local_8->mcp;
      return;
    }
    emit_gmrmi(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,0);
    return;
  }
  local_5c = 0x80;
  iVar5 = asm_isk32(local_8,(uint)(pIVar7->field_0).op2,(int32_t *)&local_48);
  if (iVar5 == 0) {
    local_5c = ra_alloc1(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                         in_stack_ffffffffffffff68);
  }
  else {
    pIVar3 = local_8->ir;
    uVar2 = (pIVar7->field_0).op1;
    if (((((((&pIVar3->field_1)[uVar2].o == '@') || ((&pIVar3->field_1)[uVar2].o == 'A')) ||
          ((&pIVar3->field_1)[uVar2].o == 'B')) ||
         (((&pIVar3->field_1)[uVar2].o == 'C' || ((&pIVar3->field_1)[uVar2].o == 'D')))) ||
        (((&pIVar3->field_1)[uVar2].o == 'E' || ((&pIVar3->field_1)[uVar2].o == 'F')))) &&
       ((((&pIVar3->field_1)[uVar2].t.irt & 0x1f) == 0xf ||
        (((&pIVar3->field_1)[uVar2].t.irt & 0x1f) == 0x10)))) {
      uVar1 = (&pIVar3->field_1)[uVar2].t.irt;
      (&pIVar3->field_1)[uVar2].t.irt = (&pIVar3->field_1)[uVar2].t.irt & 0xe0 | 0x13;
      local_8->curins = local_8->curins - 1;
      local_58 = asm_fuseload((ASMState *)
                              CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                              in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
      iVar5 = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
      local_8->curins = local_8->curins + 1;
      (&pIVar3->field_1)[uVar2].t.irt = uVar1;
      if (local_58 == 0x20) {
        asm_guardcc((ASMState *)
                    CONCAT17(uVar10,CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)),
                    iVar5);
        pMVar4 = local_8->mcp;
        local_8->mcp = pMVar4 + -1;
        pMVar4[-1] = (MCode)local_48;
        emit_mrm(local_8,XO_GROUP3b,0,0x20);
        return;
      }
      goto LAB_00175148;
    }
  }
  local_8->curins = local_8->curins - 1;
  local_58 = asm_fuseloadm((ASMState *)
                           CONCAT17(uVar10,CONCAT16(in_stack_ffffffffffffff7e,
                                                    in_stack_ffffffffffffff78)),
                           (IRRef)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                           (RegSet)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  iVar5 = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  local_8->curins = local_8->curins + 1;
LAB_00175148:
  asm_guardcc((ASMState *)
              CONCAT17(uVar10,CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)),iVar5);
  if ((local_5c & 0x80) == 0) {
    emit_mrm(local_8,XO_TEST,local_44 + local_5c,local_58);
  }
  else {
    *(uint *)(local_8->mcp + -4) = local_48;
    local_8->mcp = local_8->mcp + -4;
    emit_mrm(local_8,XO_GROUP3,local_44,local_58);
  }
  return;
}

Assistant:

static void asm_comp(ASMState *as, IRIns *ir, uint32_t cc)
{
  if (irt_isnum(ir->t)) {
    IRRef lref = ir->op1;
    IRRef rref = ir->op2;
    Reg left, right;
    MCLabel l_around;
    /*
    ** An extra CC_P branch is required to preserve ordered/unordered
    ** semantics for FP comparisons. This can be avoided by swapping
    ** the operands and inverting the condition (except for EQ and UNE).
    ** So always try to swap if possible.
    **
    ** Another option would be to swap operands to achieve better memory
    ** operand fusion. But it's unlikely that this outweighs the cost
    ** of the extra branches.
    */
    if (cc & VCC_S) {  /* Swap? */
      IRRef tmp = lref; lref = rref; rref = tmp;
      cc ^= (VCC_PS|(5<<4));  /* A <-> B, AE <-> BE, PS <-> none */
    }
    left = ra_alloc1(as, lref, RSET_FPR);
    right = asm_fuseload(as, rref, rset_exclude(RSET_FPR, left));
    l_around = emit_label(as);
    asm_guardcc(as, cc >> 4);
    if (cc & VCC_P) {  /* Extra CC_P branch required? */
      if (!(cc & VCC_U)) {
	asm_guardcc(as, CC_P);  /* Branch to exit for ordered comparisons. */
      } else if (l_around != as->invmcp) {
	emit_sjcc(as, CC_P, l_around);  /* Branch around for unordered. */
      } else {
	/* Patched to mcloop by asm_loop_fixup. */
	as->loopinv = 2;
	if (as->realign)
	  emit_sjcc(as, CC_P, as->mcp);
	else
	  emit_jcc(as, CC_P, as->mcp);
      }
    }
    emit_mrm(as, XO_UCOMISD, left, right);
  } else {
    IRRef lref = ir->op1, rref = ir->op2;
    IROp leftop = (IROp)(IR(lref)->o);
    Reg r64 = REX_64IR(ir, 0);
    int32_t imm = 0;
    lua_assert(irt_is64(ir->t) || irt_isint(ir->t) ||
	       irt_isu32(ir->t) || irt_isaddr(ir->t) || irt_isu8(ir->t));
    /* Swap constants (only for ABC) and fusable loads to the right. */
    if (irref_isk(lref) || (!irref_isk(rref) && opisfusableload(leftop))) {
      if ((cc & 0xc) == 0xc) cc ^= 0x53;  /* L <-> G, LE <-> GE */
      else if ((cc & 0xa) == 0x2) cc ^= 0x55;  /* A <-> B, AE <-> BE */
      lref = ir->op2; rref = ir->op1;
    }
    if (asm_isk32(as, rref, &imm)) {
      IRIns *irl = IR(lref);
      /* Check wether we can use test ins. Not for unsigned, since CF=0. */
      int usetest = (imm == 0 && (cc & 0xa) != 0x2);
      if (usetest && irl->o == IR_BAND && irl+1 == ir && !ra_used(irl)) {
	/* Combine comp(BAND(ref, r/imm), 0) into test mrm, r/imm. */
	Reg right, left = RID_NONE;
	RegSet allow = RSET_GPR;
	if (!asm_isk32(as, irl->op2, &imm)) {
	  left = ra_alloc1(as, irl->op2, allow);
	  rset_clear(allow, left);
	} else {  /* Try to Fuse IRT_I8/IRT_U8 loads, too. See below. */
	  IRIns *irll = IR(irl->op1);
	  if (opisfusableload((IROp)irll->o) &&
	      (irt_isi8(irll->t) || irt_isu8(irll->t))) {
	    IRType1 origt = irll->t;  /* Temporarily flip types. */
	    irll->t.irt = (irll->t.irt & ~IRT_TYPE) | IRT_INT;
	    as->curins--;  /* Skip to BAND to avoid failing in noconflict(). */
	    right = asm_fuseload(as, irl->op1, RSET_GPR);
	    as->curins++;
	    irll->t = origt;
	    if (right != RID_MRM) goto test_nofuse;
	    /* Fusion succeeded, emit test byte mrm, imm8. */
	    asm_guardcc(as, cc);
	    emit_i8(as, (imm & 0xff));
	    emit_mrm(as, XO_GROUP3b, XOg_TEST, RID_MRM);
	    return;
	  }
	}
	as->curins--;  /* Skip to BAND to avoid failing in noconflict(). */
	right = asm_fuseloadm(as, irl->op1, allow, r64);
	as->curins++;  /* Undo the above. */
      test_nofuse:
	asm_guardcc(as, cc);
	if (ra_noreg(left)) {
	  emit_i32(as, imm);
	  emit_mrm(as, XO_GROUP3, r64 + XOg_TEST, right);
	} else {
	  emit_mrm(as, XO_TEST, r64 + left, right);
	}
      } else {
	Reg left;
	if (opisfusableload((IROp)irl->o) &&
	    ((irt_isu8(irl->t) && checku8(imm)) ||
	     ((irt_isi8(irl->t) || irt_isi16(irl->t)) && checki8(imm)) ||
	     (irt_isu16(irl->t) && checku16(imm) && checki8((int16_t)imm)))) {
	  /* Only the IRT_INT case is fused by asm_fuseload.
	  ** The IRT_I8/IRT_U8 loads and some IRT_I16/IRT_U16 loads
	  ** are handled here.
	  ** Note that cmp word [mem], imm16 should not be generated,
	  ** since it has a length-changing prefix. Compares of a word
	  ** against a sign-extended imm8 are ok, however.
	  */
	  IRType1 origt = irl->t;  /* Temporarily flip types. */
	  irl->t.irt = (irl->t.irt & ~IRT_TYPE) | IRT_INT;
	  left = asm_fuseload(as, lref, RSET_GPR);
	  irl->t = origt;
	  if (left == RID_MRM) {  /* Fusion succeeded? */
	    if (irt_isu8(irl->t) || irt_isu16(irl->t))
	      cc >>= 4;  /* Need unsigned compare. */
	    asm_guardcc(as, cc);
	    emit_i8(as, imm);
	    emit_mrm(as, (irt_isi8(origt) || irt_isu8(origt)) ?
			 XO_ARITHib : XO_ARITHiw8, r64 + XOg_CMP, RID_MRM);
	    return;
	  }  /* Otherwise handle register case as usual. */
	} else {
	  left = asm_fuseloadm(as, lref,
			       irt_isu8(ir->t) ? RSET_GPR8 : RSET_GPR, r64);
	}
	asm_guardcc(as, cc);
	if (usetest && left != RID_MRM) {
	  /* Use test r,r instead of cmp r,0. */
	  x86Op xo = XO_TEST;
	  if (irt_isu8(ir->t)) {
	    lua_assert(ir->o == IR_EQ || ir->o == IR_NE);
	    xo = XO_TESTb;
	    if (!rset_test(RSET_RANGE(RID_EAX, RID_EBX+1), left)) {
	      if (LJ_64) {
		left |= FORCE_REX;
	      } else {
		emit_i32(as, 0xff);
		emit_mrm(as, XO_GROUP3, XOg_TEST, left);
		return;
	      }
	    }
	  }
	  emit_rr(as, xo, r64 + left, left);
	  if (irl+1 == ir)  /* Referencing previous ins? */
	    as->flagmcp = as->mcp;  /* Set flag to drop test r,r if possible. */
	} else {
	  emit_gmrmi(as, XG_ARITHi(XOg_CMP), r64 + left, imm);
	}
      }
    } else {
      Reg left = ra_alloc1(as, lref, RSET_GPR);
      Reg right = asm_fuseloadm(as, rref, rset_exclude(RSET_GPR, left), r64);
      asm_guardcc(as, cc);
      emit_mrm(as, XO_CMP, r64 + left, right);
    }
  }
}